

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::TestMutualRecursionB::ByteSizeLong(TestMutualRecursionB *this)

{
  int iVar1;
  long lVar2;
  anon_union_24_1_493b367e_for_TestMutualRecursionB_3 aVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  aVar3 = this->field_0;
  if (((undefined1  [24])aVar3 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar6 = 0;
  }
  else {
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = TestMutualRecursionA::ByteSizeLong((this->field_0)._impl_.a_);
      uVar5 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      uVar4 = (long)(this->field_0)._impl_.optional_int32_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t TestMutualRecursionB::ByteSizeLong() const {
  const TestMutualRecursionB& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMutualRecursionB)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.TestMutualRecursionA a = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.a_);
    }
    // int32 optional_int32 = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}